

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlComment::operator=(TiXmlComment *this,TiXmlComment *base)

{
  TiXmlComment *base_local;
  TiXmlComment *this_local;
  
  TiXmlNode::Clear(&this->super_TiXmlNode);
  CopyTo(base,this);
  return;
}

Assistant:

void TiXmlComment::operator=(const TiXmlComment& base) {
	Clear();
	base.CopyTo(this);
}